

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# provider_child.c
# Opt level: O0

void ossl_provider_deinit_child(OSSL_LIB_CTX *ctx)

{
  undefined8 *puVar1;
  OSSL_LIB_CTX_METHOD *in_RDI;
  int unaff_retaddr;
  child_prov_globals *gbl;
  
  puVar1 = (undefined8 *)ossl_lib_ctx_get_data((OSSL_LIB_CTX *)gbl,unaff_retaddr,in_RDI);
  if (puVar1 != (undefined8 *)0x0) {
    (*(code *)puVar1[5])(*puVar1);
  }
  return;
}

Assistant:

void ossl_provider_deinit_child(OSSL_LIB_CTX *ctx)
{
    struct child_prov_globals *gbl
        = ossl_lib_ctx_get_data(ctx, OSSL_LIB_CTX_CHILD_PROVIDER_INDEX,
                                &child_prov_ossl_ctx_method);
    if (gbl == NULL)
        return;

    gbl->c_provider_deregister_child_cb(gbl->handle);
}